

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Window.cxx
# Opt level: O0

void __thiscall Fl_Menu_Window::erase(Fl_Menu_Window *this)

{
  Fl_Menu_Window *this_local;
  
  return;
}

Assistant:

void Fl_Menu_Window::erase() {
#if HAVE_OVERLAY
  if (!gc || !shown()) return;
//XSetForeground(fl_display, gc, 0);
//XFillRectangle(fl_display, fl_xid(this), gc, 0, 0, w(), h());
  XClearWindow(fl_display, fl_xid(this));
#endif
}